

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

void array_run_container_lazy_xor
               (array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  run_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  run_container_t *unaff_retaddr;
  int32_t arraypos;
  int32_t rlepos;
  int local_20;
  int local_1c;
  
  run_container_grow(unaff_retaddr,(int32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  local_1c = 0;
  local_20 = 0;
  in_RDX->n_runs = 0;
  while( true ) {
    bVar1 = false;
    if (local_1c < *in_RSI) {
      bVar1 = local_20 < *in_RDI;
    }
    if (!bVar1) break;
    if (*(ushort *)(*(long *)(in_RDI + 2) + (long)local_20 * 2) <
        *(ushort *)(*(long *)(in_RSI + 2) + (long)local_1c * 4)) {
      run_container_smart_append_exclusive
                (in_RDX,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_20 * 2),0);
      local_20 = local_20 + 1;
    }
    else {
      run_container_smart_append_exclusive
                (in_RDX,*(uint16_t *)(*(long *)(in_RSI + 2) + (long)local_1c * 4),
                 *(uint16_t *)(*(long *)(in_RSI + 2) + 2 + (long)local_1c * 4));
      local_1c = local_1c + 1;
    }
  }
  for (; local_20 < *in_RDI; local_20 = local_20 + 1) {
    run_container_smart_append_exclusive
              (in_RDX,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_20 * 2),0);
  }
  for (; local_1c < *in_RSI; local_1c = local_1c + 1) {
    run_container_smart_append_exclusive
              (in_RDX,*(uint16_t *)(*(long *)(in_RSI + 2) + (long)local_1c * 4),
               *(uint16_t *)(*(long *)(in_RSI + 2) + 2 + (long)local_1c * 4));
  }
  return;
}

Assistant:

void array_run_container_lazy_xor(const array_container_t *src_1,
                                  const run_container_t *src_2,
                                  run_container_t *dst) {
    run_container_grow(dst, src_1->cardinality + src_2->n_runs, false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    dst->n_runs = 0;

    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                                 src_2->runs[rlepos].length);
            rlepos++;
        } else {
            run_container_smart_append_exclusive(dst, src_1->array[arraypos],
                                                 0);
            arraypos++;
        }
    }
    while (arraypos < src_1->cardinality) {
        run_container_smart_append_exclusive(dst, src_1->array[arraypos], 0);
        arraypos++;
    }
    while (rlepos < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                             src_2->runs[rlepos].length);
        rlepos++;
    }
}